

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  int node;
  int iVar1;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  FuncState *in_RDI;
  int in_R8D;
  int next;
  int in_stack_ffffffffffffffe0;
  
  while (in_ESI != -1) {
    node = getjump(in_RDI,in_ESI);
    iVar1 = patchtestreg((FuncState *)CONCAT44(in_ECX,in_R8D),node,in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      fixjump((FuncState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
      in_ESI = node;
    }
    else {
      fixjump((FuncState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
      in_ESI = node;
    }
  }
  return;
}

Assistant:

static void patchlistaux(FuncState*fs,int list,int vtarget,int reg,
int dtarget){
while(list!=(-1)){
int next=getjump(fs,list);
if(patchtestreg(fs,list,reg))
fixjump(fs,list,vtarget);
else
fixjump(fs,list,dtarget);
list=next;
}
}